

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht.c
# Opt level: O2

void lgx_ht_cleanup(lgx_ht_t *ht)

{
  lgx_ht_node_s *plVar1;
  lgx_ht_node_t *node;
  int i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < ht->size; uVar2 = uVar2 + 1) {
    node = ht->table[uVar2];
    while (node != (lgx_ht_node_t *)0x0) {
      plVar1 = node->next;
      ht_node_del(node);
      node = plVar1;
    }
  }
  free(ht->table);
  ht->head = (lgx_ht_node_t *)0x0;
  ht->tail = (lgx_ht_node_t *)0x0;
  ht->size = 0;
  ht->length = 0;
  ht->table = (lgx_ht_node_t **)0x0;
  return;
}

Assistant:

void lgx_ht_cleanup(lgx_ht_t* ht) {
    int i;
    lgx_ht_node_t *node, *next;
    for (i = 0; i < ht->size; i++) {
        node = ht->table[i];
        while (node) {
            next = node->next;
            ht_node_del(node);
            node = next;
        }
    }

    xfree(ht->table);

    memset(ht, 0, sizeof(lgx_ht_t));
}